

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O3

QAction * __thiscall QUndoGroup::createUndoAction(QUndoGroup *this,QObject *parent,QString *prefix)

{
  QUndoStack *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  long lVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  bool b;
  QAction *this_00;
  long lVar11;
  undefined4 *puVar12;
  long in_FS_OFFSET;
  QObject local_c0 [8];
  QObject local_b8 [8];
  code *local_b0;
  ImplFn local_a8;
  QObject local_a0 [8];
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  QAction::QAction(this_00,parent);
  pQVar1 = *(QUndoStack **)(*(long *)&this->field_0x8 + 0x78);
  if (pQVar1 == (QUndoStack *)0x0) {
    b = false;
  }
  else {
    b = QUndoStack::canUndo(pQVar1);
  }
  QAction::setEnabled(this_00,b);
  local_58.d.d = (prefix->d).d;
  local_58.d.ptr = (prefix->d).ptr;
  local_58.d.size = (prefix->d).size;
  lVar11 = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    lVar11 = (prefix->d).size;
  }
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  if (lVar11 == 0) {
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6c603e);
    pcVar3 = local_58.d.ptr;
    pDVar8 = local_58.d.d;
    qVar7 = local_98.d.size;
    pDVar6 = local_98.d.d;
    local_98.d.d = local_58.d.d;
    local_58.d.d = pDVar6;
    local_58.d.ptr = local_98.d.ptr;
    local_98.d.ptr = pcVar3;
    local_98.d.size = local_58.d.size;
    local_58.d.size = qVar7;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6c6046);
    pcVar3 = local_78.d.ptr;
    pDVar8 = local_78.d.d;
    qVar7 = local_98.d.size;
    pDVar6 = local_98.d.d;
    pQVar2 = &(local_78.d.d)->super_QArrayData;
    lVar4 = local_78.d.size;
    pQVar5 = &(local_98.d.d)->super_QArrayData;
    local_78.d.ptr = local_98.d.ptr;
    local_98.d.d = local_78.d.d;
    local_78.d.d = pDVar6;
    lVar11 = local_98.d.size;
    local_98.d.ptr = pcVar3;
    local_98.d.size = local_78.d.size;
    local_78.d.size = qVar7;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = *(QUndoStack **)(*(long *)&this->field_0x8 + 0x78);
  if (pQVar1 == (QUndoStack *)0x0) {
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    local_98.d.size = 0;
  }
  else {
    QUndoStack::undoText(&local_98,pQVar1);
  }
  QUndoStackPrivate::setPrefixedText(this_00,&local_58,&local_78,&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_b0 = QAction::setEnabled;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)canUndoChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::QCallableObject<void_(QAction::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar12 + 4) = QAction::setEnabled;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)this,(QObject *)&local_98,(void **)this_00,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  qVar10 = local_58.d.size;
  pcVar9 = local_58.d.ptr;
  pDVar8 = local_58.d.d;
  qVar7 = local_78.d.size;
  pcVar3 = local_78.d.ptr;
  pDVar6 = local_78.d.d;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.d = (Data *)undoTextChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar12 = (undefined4 *)operator_new(0x48);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/util/qundogroup.cpp:252:57),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QAction **)(puVar12 + 4) = this_00;
  *(Data **)(puVar12 + 6) = pDVar8;
  *(char16_t **)(puVar12 + 8) = pcVar9;
  *(qsizetype *)(puVar12 + 10) = qVar10;
  *(Data **)(puVar12 + 0xc) = pDVar6;
  *(char16_t **)(puVar12 + 0xe) = pcVar3;
  *(qsizetype *)(puVar12 + 0x10) = qVar7;
  QObject::connectImpl
            (local_b8,(void **)this,(QObject *)&local_98,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  local_b0 = undo;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)QAction::triggered;
  local_98.d.ptr = (char16_t *)0x0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::QCallableObject<void_(QUndoGroup::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar12 + 4) = undo;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)this_00,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QUndoGroup::createUndoAction(QObject *parent, const QString &prefix) const
{
    QAction *action = new QAction(parent);
    action->setEnabled(canUndo());

    QString effectivePrefix = prefix;
    QString defaultText;
    if (prefix.isEmpty()) {
        effectivePrefix = tr("Undo %1");
        defaultText = tr("Undo", "Default text for undo action");
    }

    QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, undoText());

    connect(this, &QUndoGroup::canUndoChanged, action, &QAction::setEnabled);
    connect(this, &QUndoGroup::undoTextChanged, action, [=](const QString &text) {
        QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, text);
    });
    connect(action, &QAction::triggered, this, &QUndoGroup::undo);

    return action;
}